

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O0

int SampleFormatIsValid(PaSampleFormat format)

{
  ulong uVar1;
  PaSampleFormat format_local;
  
  uVar1 = format & 0xffffffff7fffffff;
  if (uVar1 == 1) {
    format_local._4_4_ = 1;
  }
  else if (uVar1 == 2) {
    format_local._4_4_ = 1;
  }
  else if (uVar1 == 4) {
    format_local._4_4_ = 1;
  }
  else if (uVar1 == 8) {
    format_local._4_4_ = 1;
  }
  else if (uVar1 == 0x10) {
    format_local._4_4_ = 1;
  }
  else if (uVar1 == 0x20) {
    format_local._4_4_ = 1;
  }
  else if (uVar1 == 0x10000) {
    format_local._4_4_ = 1;
  }
  else {
    format_local._4_4_ = 0;
  }
  return format_local._4_4_;
}

Assistant:

static int SampleFormatIsValid( PaSampleFormat format )
{
    switch( format & ~paNonInterleaved )
    {
    case paFloat32: return 1;
    case paInt16: return 1;
    case paInt32: return 1;
    case paInt24: return 1;
    case paInt8: return 1;
    case paUInt8: return 1;
    case paCustomFormat: return 1;
    default: return 0;
    }
}